

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecayedException.h
# Opt level: O1

void __thiscall
libsgp4::DecayedException::DecayedException
          (DecayedException *this,DateTime *dt,Vector *pos,Vector *vel)

{
  std::runtime_error::runtime_error(&this->super_runtime_error,"Satellite decayed");
  *(undefined ***)this = &PTR__runtime_error_0010cd40;
  (this->_dt).m_encoded = dt->m_encoded;
  (this->_pos).x = 0.0;
  (this->_pos).y = 0.0;
  (this->_pos).z = 0.0;
  (this->_pos).w = 0.0;
  (this->_pos).x = pos->x;
  (this->_pos).y = pos->y;
  (this->_pos).z = pos->z;
  (this->_pos).w = pos->w;
  (this->_vel).x = 0.0;
  (this->_vel).y = 0.0;
  (this->_vel).z = 0.0;
  (this->_vel).w = 0.0;
  (this->_vel).x = vel->x;
  (this->_vel).y = vel->y;
  (this->_vel).z = vel->z;
  (this->_vel).w = vel->w;
  return;
}

Assistant:

DecayedException(const DateTime& dt, const Vector& pos, const Vector& vel)
        : runtime_error("Satellite decayed")
        , _dt(dt)
        , _pos(pos)
        , _vel(vel)
    {
    }